

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_> __thiscall
cmMakefileTargetGenerator::New(cmMakefileTargetGenerator *this,cmGeneratorTarget *tgt)

{
  TargetType TVar1;
  unique_ptr<cmMakefileUtilityTargetGenerator,_std::default_delete<cmMakefileUtilityTargetGenerator>_>
  local_48;
  unique_ptr<cmMakefileLibraryTargetGenerator,_std::default_delete<cmMakefileLibraryTargetGenerator>_>
  local_40;
  unique_ptr<cmMakefileExecutableTargetGenerator,_std::default_delete<cmMakefileExecutableTargetGenerator>_>
  local_38 [3];
  undefined1 local_19;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *tgt_local;
  unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_> *result;
  
  local_19 = 0;
  local_18 = tgt;
  tgt_local = (cmGeneratorTarget *)this;
  std::unique_ptr<cmMakefileTargetGenerator,std::default_delete<cmMakefileTargetGenerator>>::
  unique_ptr<std::default_delete<cmMakefileTargetGenerator>,void>
            ((unique_ptr<cmMakefileTargetGenerator,std::default_delete<cmMakefileTargetGenerator>> *
             )this);
  TVar1 = cmGeneratorTarget::GetType(local_18);
  switch(TVar1) {
  case EXECUTABLE:
    std::make_unique<cmMakefileExecutableTargetGenerator,cmGeneratorTarget*&>
              ((cmGeneratorTarget **)local_38);
    std::unique_ptr<cmMakefileTargetGenerator,std::default_delete<cmMakefileTargetGenerator>>::
    operator=((unique_ptr<cmMakefileTargetGenerator,std::default_delete<cmMakefileTargetGenerator>>
               *)this,local_38);
    std::
    unique_ptr<cmMakefileExecutableTargetGenerator,_std::default_delete<cmMakefileExecutableTargetGenerator>_>
    ::~unique_ptr(local_38);
    break;
  case STATIC_LIBRARY:
  case SHARED_LIBRARY:
  case MODULE_LIBRARY:
  case OBJECT_LIBRARY:
    std::make_unique<cmMakefileLibraryTargetGenerator,cmGeneratorTarget*&>
              ((cmGeneratorTarget **)&local_40);
    std::unique_ptr<cmMakefileTargetGenerator,std::default_delete<cmMakefileTargetGenerator>>::
    operator=((unique_ptr<cmMakefileTargetGenerator,std::default_delete<cmMakefileTargetGenerator>>
               *)this,&local_40);
    std::
    unique_ptr<cmMakefileLibraryTargetGenerator,_std::default_delete<cmMakefileLibraryTargetGenerator>_>
    ::~unique_ptr(&local_40);
    break;
  case UTILITY:
  case INTERFACE_LIBRARY:
    std::make_unique<cmMakefileUtilityTargetGenerator,cmGeneratorTarget*&>
              ((cmGeneratorTarget **)&local_48);
    std::unique_ptr<cmMakefileTargetGenerator,std::default_delete<cmMakefileTargetGenerator>>::
    operator=((unique_ptr<cmMakefileTargetGenerator,std::default_delete<cmMakefileTargetGenerator>>
               *)this,&local_48);
    std::
    unique_ptr<cmMakefileUtilityTargetGenerator,_std::default_delete<cmMakefileUtilityTargetGenerator>_>
    ::~unique_ptr(&local_48);
    break;
  default:
  }
  return (__uniq_ptr_data<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>,_true,_true>
          )(__uniq_ptr_data<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmMakefileTargetGenerator> cmMakefileTargetGenerator::New(
  cmGeneratorTarget* tgt)
{
  std::unique_ptr<cmMakefileTargetGenerator> result;

  switch (tgt->GetType()) {
    case cmStateEnums::EXECUTABLE:
      result = cm::make_unique<cmMakefileExecutableTargetGenerator>(tgt);
      break;
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      result = cm::make_unique<cmMakefileLibraryTargetGenerator>(tgt);
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UTILITY:
      result = cm::make_unique<cmMakefileUtilityTargetGenerator>(tgt);
      break;
    default:
      return result;
      // break; /* unreachable */
  }
  return result;
}